

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

void __thiscall
ON_Evaluator::ON_Evaluator
          (ON_Evaluator *this,int parameter_count,int value_count,ON_Interval *domain,bool *periodic
          )

{
  ON_SimpleArray<bool> *this_00;
  ulong uVar1;
  long lVar2;
  bool local_41;
  ON_SimpleArray<bool> *local_40;
  bool *local_38;
  
  this->_vptr_ON_Evaluator = (_func_int **)&PTR__ON_Evaluator_008229c8;
  if (value_count < 1) {
    value_count = parameter_count;
  }
  this->m_parameter_count = parameter_count;
  this->m_value_count = value_count;
  (this->m_domain)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00822a08;
  (this->m_domain).m_a = (ON_Interval *)0x0;
  (this->m_domain).m_count = 0;
  (this->m_domain).m_capacity = 0;
  (this->m_bPeriodicParameter)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008189b0;
  (this->m_bPeriodicParameter).m_a = (bool *)0x0;
  (this->m_bPeriodicParameter).m_count = 0;
  (this->m_bPeriodicParameter).m_capacity = 0;
  if (domain != (ON_Interval *)0x0) {
    local_40 = &this->m_bPeriodicParameter;
    local_38 = periodic;
    if ((uint)(this->m_domain).m_capacity < (uint)parameter_count) {
      ON_SimpleArray<ON_Interval>::SetCapacity(&this->m_domain,(long)parameter_count);
    }
    uVar1 = (ulong)(uint)parameter_count;
    if (0 < parameter_count) {
      do {
        ON_SimpleArray<ON_Interval>::Append(&this->m_domain,domain);
        domain = domain + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    if (0 < parameter_count && local_38 != (bool *)0x0) {
      uVar1 = 0;
      do {
        if (local_38[uVar1] == true) {
          if ((uint)(this->m_bPeriodicParameter).m_capacity < (uint)this->m_parameter_count) {
            ON_SimpleArray<bool>::SetCapacity(local_40,(long)this->m_parameter_count);
          }
          this_00 = local_40;
          if (this->m_parameter_count < 1) {
            return;
          }
          lVar2 = 0;
          do {
            local_41 = local_38[lVar2];
            ON_SimpleArray<bool>::Append(this_00,&local_41);
            lVar2 = lVar2 + 1;
          } while (lVar2 < this->m_parameter_count);
          return;
        }
        uVar1 = uVar1 + 1;
      } while ((uint)parameter_count != uVar1);
    }
  }
  return;
}

Assistant:

ON_Evaluator::ON_Evaluator( 
                           int parameter_count,
                           int value_count,
                           const ON_Interval* domain,
                           const bool* periodic
                           )
             : m_parameter_count(parameter_count),
               m_value_count(value_count>0?value_count:parameter_count)
{
  int i;

  if (domain)
  {
    m_domain.Reserve(m_parameter_count);
    for ( i = 0; i < parameter_count; i++ )
      m_domain.Append(domain[i]);

    if (periodic )
    {
      for ( i = 0; i < parameter_count; i++ )
      {
        if  (periodic[i])
        {
          m_bPeriodicParameter.Reserve(m_parameter_count);
          for ( i = 0; i < m_parameter_count; i++ )
          {
            m_bPeriodicParameter.Append(periodic[i]?true:false);
          }
          break;
        }
      }
    }
  }
}